

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O0

c_int osqp_update_rho(OSQPWorkspace *work,c_float rho_new)

{
  long *in_RDI;
  OSQPTimer *in_XMM0_Qa;
  c_float cVar1;
  c_int i;
  c_int exitflag;
  char *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  OSQPTimer *local_38;
  OSQPTimer *local_30;
  long local_28;
  c_int local_8;
  
  if (in_RDI == (long *)0x0) {
    local_8 = _osqp_error((osqp_error_type)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                          in_stack_ffffffffffffffb8);
  }
  else if (0.0 < (double)in_XMM0_Qa) {
    if (in_RDI[0x1e] == 0) {
      if (in_RDI[0x1d] == 1) {
        in_RDI[0x1d] = 0;
        *(undefined8 *)(in_RDI[0x1a] + 0x60) = 0;
      }
      osqp_tic((OSQPTimer *)0x2721ff);
    }
    local_30 = in_XMM0_Qa;
    if ((double)in_XMM0_Qa <= 1e-06) {
      local_30 = (OSQPTimer *)0x3eb0c6f7a0b5ed8d;
    }
    if (1000000.0 <= (double)local_30) {
      local_38 = (OSQPTimer *)0x412e848000000000;
    }
    else {
      local_38 = in_XMM0_Qa;
      if ((double)in_XMM0_Qa <= 1e-06) {
        local_38 = (OSQPTimer *)0x3eb0c6f7a0b5ed8d;
      }
    }
    *(OSQPTimer **)in_RDI[0x17] = local_38;
    for (local_28 = 0; local_28 < *(long *)(*in_RDI + 8); local_28 = local_28 + 1) {
      if (*(long *)(in_RDI[5] + local_28 * 8) == 0) {
        *(undefined8 *)(in_RDI[3] + local_28 * 8) = *(undefined8 *)in_RDI[0x17];
        *(double *)(in_RDI[4] + local_28 * 8) = 1.0 / *(double *)in_RDI[0x17];
      }
      else if (*(long *)(in_RDI[5] + local_28 * 8) == 1) {
        *(double *)(in_RDI[3] + local_28 * 8) = *(double *)in_RDI[0x17] * 1000.0;
        *(double *)(in_RDI[4] + local_28 * 8) = 1.0 / *(double *)(in_RDI[3] + local_28 * 8);
      }
    }
    local_8 = (**(code **)(in_RDI[1] + 0x20))(in_RDI[1],in_RDI[3]);
    if (in_RDI[0x1e] == 0) {
      cVar1 = osqp_toc(local_38);
      *(double *)(in_RDI[0x1a] + 0x60) = cVar1 + *(double *)(in_RDI[0x1a] + 0x60);
    }
  }
  else {
    printf("ERROR in %s: ","osqp_update_rho");
    printf("rho must be positive");
    printf("\n");
    local_8 = 1;
  }
  return local_8;
}

Assistant:

c_int osqp_update_rho(OSQPWorkspace *work, c_float rho_new) {
  c_int exitflag, i;

  // Check if workspace has been initialized
  if (!work) return osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR);

  // Check value of rho
  if (rho_new <= 0) {
# ifdef PRINTING
    c_eprint("rho must be positive");
# endif /* ifdef PRINTING */
    return 1;
  }

#ifdef PROFILING
  if (work->rho_update_from_solve == 0) {
    if (work->clear_update_time == 1) {
      work->clear_update_time = 0;
      work->info->update_time = 0.0;
    }
    osqp_tic(work->timer); // Start timer
  }
#endif /* ifdef PROFILING */

  // Update rho in settings
  work->settings->rho = c_min(c_max(rho_new, RHO_MIN), RHO_MAX);

  // Update rho_vec and rho_inv_vec
  for (i = 0; i < work->data->m; i++) {
    if (work->constr_type[i] == 0) {
      // Inequalities
      work->rho_vec[i]     = work->settings->rho;
      work->rho_inv_vec[i] = 1. / work->settings->rho;
    }
    else if (work->constr_type[i] == 1) {
      // Equalities
      work->rho_vec[i]     = RHO_EQ_OVER_RHO_INEQ * work->settings->rho;
      work->rho_inv_vec[i] = 1. / work->rho_vec[i];
    }
  }

  // Update rho_vec in KKT matrix
  exitflag = work->linsys_solver->update_rho_vec(work->linsys_solver,
                                                 work->rho_vec);

#ifdef PROFILING
  if (work->rho_update_from_solve == 0)
    work->info->update_time += osqp_toc(work->timer);
#endif /* ifdef PROFILING */

  return exitflag;
}